

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRProgram.cc
# Opt level: O2

ConstantValue<flow::util::Cidr,_(flow::LiteralType)6> * __thiscall
flow::IRProgram::get<flow::ConstantValue<flow::util::Cidr,(flow::LiteralType)6>,flow::util::Cidr>
          (IRProgram *this,
          vector<std::unique_ptr<flow::ConstantValue<flow::util::Cidr,_(flow::LiteralType)6>,_std::default_delete<flow::ConstantValue<flow::util::Cidr,_(flow::LiteralType)6>_>_>,_std::allocator<std::unique_ptr<flow::ConstantValue<flow::util::Cidr,_(flow::LiteralType)6>,_std::default_delete<flow::ConstantValue<flow::util::Cidr,_(flow::LiteralType)6>_>_>_>_>
          *table,Cidr *literal)

{
  undefined8 uVar1;
  pointer puVar2;
  bool bVar3;
  pointer puVar4;
  long lVar5;
  long lVar6;
  undefined8 *puVar7;
  Cidr *pCVar8;
  long lVar9;
  byte bVar10;
  long *local_80 [10];
  
  bVar10 = 0;
  puVar4 = (table->
           super__Vector_base<std::unique_ptr<flow::ConstantValue<flow::util::Cidr,_(flow::LiteralType)6>,_std::default_delete<flow::ConstantValue<flow::util::Cidr,_(flow::LiteralType)6>_>_>,_std::allocator<std::unique_ptr<flow::ConstantValue<flow::util::Cidr,_(flow::LiteralType)6>,_std::default_delete<flow::ConstantValue<flow::util::Cidr,_(flow::LiteralType)6>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  puVar2 = (table->
           super__Vector_base<std::unique_ptr<flow::ConstantValue<flow::util::Cidr,_(flow::LiteralType)6>,_std::default_delete<flow::ConstantValue<flow::util::Cidr,_(flow::LiteralType)6>_>_>,_std::allocator<std::unique_ptr<flow::ConstantValue<flow::util::Cidr,_(flow::LiteralType)6>,_std::default_delete<flow::ConstantValue<flow::util::Cidr,_(flow::LiteralType)6>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  lVar6 = 0;
  lVar9 = 0;
  do {
    if ((long)puVar4 - (long)puVar2 >> 3 == lVar9) {
      std::
      make_unique<flow::ConstantValue<flow::util::Cidr,(flow::LiteralType)6>,flow::util::Cidr_const&>
                ((Cidr *)local_80);
      std::
      vector<std::unique_ptr<flow::ConstantValue<flow::util::Cidr,(flow::LiteralType)6>,std::default_delete<flow::ConstantValue<flow::util::Cidr,(flow::LiteralType)6>>>,std::allocator<std::unique_ptr<flow::ConstantValue<flow::util::Cidr,(flow::LiteralType)6>,std::default_delete<flow::ConstantValue<flow::util::Cidr,(flow::LiteralType)6>>>>>
      ::
      emplace_back<std::unique_ptr<flow::ConstantValue<flow::util::Cidr,(flow::LiteralType)6>,std::default_delete<flow::ConstantValue<flow::util::Cidr,(flow::LiteralType)6>>>>
                ((vector<std::unique_ptr<flow::ConstantValue<flow::util::Cidr,(flow::LiteralType)6>,std::default_delete<flow::ConstantValue<flow::util::Cidr,(flow::LiteralType)6>>>,std::allocator<std::unique_ptr<flow::ConstantValue<flow::util::Cidr,(flow::LiteralType)6>,std::default_delete<flow::ConstantValue<flow::util::Cidr,(flow::LiteralType)6>>>>>
                  *)table,(unique_ptr<flow::ConstantValue<flow::util::Cidr,_(flow::LiteralType)6>,_std::default_delete<flow::ConstantValue<flow::util::Cidr,_(flow::LiteralType)6>_>_>
                           *)local_80);
      if (local_80[0] != (long *)0x0) {
        (**(code **)(*local_80[0] + 8))();
      }
      puVar4 = (table->
               super__Vector_base<std::unique_ptr<flow::ConstantValue<flow::util::Cidr,_(flow::LiteralType)6>,_std::default_delete<flow::ConstantValue<flow::util::Cidr,_(flow::LiteralType)6>_>_>,_std::allocator<std::unique_ptr<flow::ConstantValue<flow::util::Cidr,_(flow::LiteralType)6>,_std::default_delete<flow::ConstantValue<flow::util::Cidr,_(flow::LiteralType)6>_>_>_>_>
               )._M_impl.super__Vector_impl_data._M_finish + -1;
LAB_001415b1:
      return (puVar4->_M_t).
             super___uniq_ptr_impl<flow::ConstantValue<flow::util::Cidr,_(flow::LiteralType)6>,_std::default_delete<flow::ConstantValue<flow::util::Cidr,_(flow::LiteralType)6>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_flow::ConstantValue<flow::util::Cidr,_(flow::LiteralType)6>_*,_std::default_delete<flow::ConstantValue<flow::util::Cidr,_(flow::LiteralType)6>_>_>
             .
             super__Head_base<0UL,_flow::ConstantValue<flow::util::Cidr,_(flow::LiteralType)6>_*,_false>
             ._M_head_impl;
    }
    puVar7 = (undefined8 *)
             ((long)(table->
                    super__Vector_base<std::unique_ptr<flow::ConstantValue<flow::util::Cidr,_(flow::LiteralType)6>,_std::default_delete<flow::ConstantValue<flow::util::Cidr,_(flow::LiteralType)6>_>_>,_std::allocator<std::unique_ptr<flow::ConstantValue<flow::util::Cidr,_(flow::LiteralType)6>,_std::default_delete<flow::ConstantValue<flow::util::Cidr,_(flow::LiteralType)6>_>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start[lVar9]._M_t.
                    super___uniq_ptr_impl<flow::ConstantValue<flow::util::Cidr,_(flow::LiteralType)6>,_std::default_delete<flow::ConstantValue<flow::util::Cidr,_(flow::LiteralType)6>_>_>
                    ._M_t + 0x48);
    pCVar8 = (Cidr *)local_80;
    for (lVar5 = 10; lVar5 != 0; lVar5 = lVar5 + -1) {
      uVar1 = *puVar7;
      (pCVar8->ipaddr_).family_ = (int)uVar1;
      (pCVar8->ipaddr_).cstr_[0] = (char)((ulong)uVar1 >> 0x20);
      (pCVar8->ipaddr_).cstr_[1] = (char)((ulong)uVar1 >> 0x28);
      (pCVar8->ipaddr_).cstr_[2] = (char)((ulong)uVar1 >> 0x30);
      (pCVar8->ipaddr_).cstr_[3] = (char)((ulong)uVar1 >> 0x38);
      puVar7 = puVar7 + (ulong)bVar10 * -2 + 1;
      pCVar8 = (Cidr *)((long)pCVar8 + (ulong)bVar10 * -0x10 + 8);
    }
    bVar3 = util::operator==((Cidr *)local_80,literal);
    if (bVar3) {
      puVar4 = (pointer)((long)(table->
                               super__Vector_base<std::unique_ptr<flow::ConstantValue<flow::util::Cidr,_(flow::LiteralType)6>,_std::default_delete<flow::ConstantValue<flow::util::Cidr,_(flow::LiteralType)6>_>_>,_std::allocator<std::unique_ptr<flow::ConstantValue<flow::util::Cidr,_(flow::LiteralType)6>,_std::default_delete<flow::ConstantValue<flow::util::Cidr,_(flow::LiteralType)6>_>_>_>_>
                               )._M_impl.super__Vector_impl_data._M_start - lVar6);
      goto LAB_001415b1;
    }
    lVar9 = lVar9 + 1;
    lVar6 = lVar6 + -8;
  } while( true );
}

Assistant:

T* IRProgram::get(std::vector<std::unique_ptr<T>>& table, const U& literal) {
  for (size_t i = 0, e = table.size(); i != e; ++i)
    if (table[i]->get() == literal)
      return table[i].get();

  table.emplace_back(std::make_unique<T>(literal));
  return table.back().get();
}